

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseReservedNumbers
          (Parser *this,DescriptorProto *message,LocationRecorder *parent_location)

{
  bool bVar1;
  bool bVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>_>
  *descriptor;
  char *pcVar3;
  int iVar4;
  int iVar5;
  ErrorMaker error;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  int local_b8;
  int start;
  LocationRecorder *local_b0;
  LocationRecorder start_location;
  Token start_token;
  LocationRecorder location;
  
  bVar2 = true;
  local_b0 = parent_location;
  do {
    LocationRecorder::LocationRecorder(&location,local_b0,*(int *)((long)&message->field_0 + 0xa0));
    descriptor = internal::RepeatedPtrFieldBase::
                 Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                           (&(message->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase);
    LocationRecorder::RecordLegacyLocation(&location,&descriptor->super_Message,NUMBER);
    start_token.text._M_dataplus._M_p = (pointer)&start_token.text.field_2;
    start_token.text._M_string_length = 0;
    start_token.text.field_2._M_local_buf[0] = '\0';
    LocationRecorder::LocationRecorder(&start_location,&location,1);
    io::Tokenizer::Token::operator=(&start_token,&this->input_->current_);
    pcVar3 = "Expected field number range.";
    if (bVar2) {
      pcVar3 = "Expected field name or number range.";
    }
    error.func_ = (_func_string_void_ptr *)0x0;
    error.field_0.error_ = pcVar3;
    bVar1 = ConsumeInteger(this,&start,error);
    LocationRecorder::~LocationRecorder(&start_location);
    if (bVar1) {
      text._M_str = "to";
      text._M_len = 2;
      bVar1 = TryConsume(this,text);
      if (bVar1) {
        LocationRecorder::LocationRecorder(&start_location,&location,2);
        text_00._M_str = "max";
        text_00._M_len = 3;
        bVar1 = TryConsume(this,text_00);
        iVar5 = -2;
        if ((!bVar1) &&
           (bVar1 = ConsumeInteger(this,&local_b8,(ErrorMaker)ZEXT816(0x2fb794)), iVar5 = local_b8,
           !bVar1)) {
          LocationRecorder::~LocationRecorder(&start_location);
          goto LAB_001aeac6;
        }
        LocationRecorder::~LocationRecorder(&start_location);
        iVar4 = start;
      }
      else {
        LocationRecorder::LocationRecorder(&start_location,&location,2);
        LocationRecorder::StartAt(&start_location,&start_token);
        LocationRecorder::EndAt(&start_location,&start_token);
        iVar4 = start;
        LocationRecorder::~LocationRecorder(&start_location);
        iVar5 = iVar4;
      }
      local_b8 = iVar5 + 1;
      (descriptor->field_0)._impl_.start_ = iVar4;
      (descriptor->field_0)._impl_.end_ = local_b8;
      *(byte *)&descriptor->field_0 = *(byte *)&descriptor->field_0 | 3;
      bVar1 = true;
      bVar2 = false;
    }
    else {
LAB_001aeac6:
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&start_token.text);
    LocationRecorder::~LocationRecorder(&location);
    if (!bVar1) {
      return false;
    }
    text_01._M_str = ",";
    text_01._M_len = 1;
    bVar1 = TryConsume(this,text_01);
    if (!bVar1) {
      text_02._M_str = ";";
      text_02._M_len = 1;
      bVar2 = ConsumeEndOfDeclaration(this,text_02,local_b0);
      return bVar2;
    }
  } while( true );
}

Assistant:

bool Parser::ParseReservedNumbers(DescriptorProto* message,
                                  const LocationRecorder& parent_location) {
  bool first = true;
  do {
    LocationRecorder location(parent_location, message->reserved_range_size());

    DescriptorProto::ReservedRange* range = message->add_reserved_range();
    location.RecordLegacyLocation(range,
                                  DescriptorPool::ErrorCollector::NUMBER);
    int start, end;
    io::Tokenizer::Token start_token;
    {
      LocationRecorder start_location(
          location, DescriptorProto::ReservedRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeInteger(&start, (first ? "Expected field name or number range."
                                       : "Expected field number range.")));
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, DescriptorProto::ReservedRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // Set to the sentinel value - 1 since we increment the value below.
        // The actual value of the end of the range should be set with
        // AdjustExtensionRangesWithMaxEndNumber.
        end = kMaxRangeSentinel - 1;
      } else {
        DO(ConsumeInteger(&end, "Expected integer."));
      }
    } else {
      LocationRecorder end_location(
          location, DescriptorProto::ReservedRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    // Users like to specify inclusive ranges, but in code we like the end
    // number to be exclusive.
    ++end;

    range->set_start(start);
    range->set_end(end);
    first = false;
  } while (TryConsume(","));

  DO(ConsumeEndOfDeclaration(";", &parent_location));
  return true;
}